

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_sCAL_s(png_const_structrp png_ptr,png_inforp info_ptr,int unit,png_const_charp swidth,
                   png_const_charp sheight)

{
  int iVar1;
  size_t size;
  size_t size_00;
  png_charp pcVar2;
  png_size_t lengthh;
  png_size_t lengthw;
  png_const_charp sheight_local;
  png_const_charp swidth_local;
  int unit_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) {
    if ((unit != 1) && (unit != 2)) {
      png_error(png_ptr,"Invalid sCAL unit");
    }
    if ((((swidth == (png_const_charp)0x0) || (size = strlen(swidth), size == 0)) ||
        (*swidth == '-')) || (iVar1 = png_check_fp_string(swidth,size), iVar1 == 0)) {
      png_error(png_ptr,"Invalid sCAL width");
    }
    if (((sheight == (png_const_charp)0x0) || (size_00 = strlen(sheight), size_00 == 0)) ||
       ((*sheight == '-' || (iVar1 = png_check_fp_string(sheight,size_00), iVar1 == 0)))) {
      png_error(png_ptr,"Invalid sCAL height");
    }
    info_ptr->scal_unit = (png_byte)unit;
    pcVar2 = (png_charp)png_malloc_warn(png_ptr,size + 1);
    info_ptr->scal_s_width = pcVar2;
    if (info_ptr->scal_s_width == (png_charp)0x0) {
      png_warning(png_ptr,"Memory allocation failed while processing sCAL");
    }
    else {
      memcpy(info_ptr->scal_s_width,swidth,size + 1);
      pcVar2 = (png_charp)png_malloc_warn(png_ptr,size_00 + 1);
      info_ptr->scal_s_height = pcVar2;
      if (info_ptr->scal_s_height == (png_charp)0x0) {
        png_free(png_ptr,info_ptr->scal_s_width);
        info_ptr->scal_s_width = (png_charp)0x0;
        png_warning(png_ptr,"Memory allocation failed while processing sCAL");
      }
      else {
        memcpy(info_ptr->scal_s_height,sheight,size_00 + 1);
        info_ptr->valid = info_ptr->valid | 0x4000;
        info_ptr->free_me = info_ptr->free_me | 0x100;
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_sCAL_s(png_const_structrp png_ptr, png_inforp info_ptr,
    int unit, png_const_charp swidth, png_const_charp sheight)
{
   png_size_t lengthw = 0, lengthh = 0;

   png_debug1(1, "in %s storage function", "sCAL");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   /* Double check the unit (should never get here with an invalid
    * unit unless this is an API call.)
    */
   if (unit != 1 && unit != 2)
      png_error(png_ptr, "Invalid sCAL unit");

   if (swidth == NULL || (lengthw = strlen(swidth)) == 0 ||
       swidth[0] == 45 /* '-' */ || !png_check_fp_string(swidth, lengthw))
      png_error(png_ptr, "Invalid sCAL width");

   if (sheight == NULL || (lengthh = strlen(sheight)) == 0 ||
       sheight[0] == 45 /* '-' */ || !png_check_fp_string(sheight, lengthh))
      png_error(png_ptr, "Invalid sCAL height");

   info_ptr->scal_unit = (png_byte)unit;

   ++lengthw;

   png_debug1(3, "allocating unit for info (%u bytes)", (unsigned int)lengthw);

   info_ptr->scal_s_width = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, lengthw));

   if (info_ptr->scal_s_width == NULL)
   {
      png_warning(png_ptr, "Memory allocation failed while processing sCAL");

      return;
   }

   memcpy(info_ptr->scal_s_width, swidth, lengthw);

   ++lengthh;

   png_debug1(3, "allocating unit for info (%u bytes)", (unsigned int)lengthh);

   info_ptr->scal_s_height = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, lengthh));

   if (info_ptr->scal_s_height == NULL)
   {
      png_free (png_ptr, info_ptr->scal_s_width);
      info_ptr->scal_s_width = NULL;

      png_warning(png_ptr, "Memory allocation failed while processing sCAL");

      return;
   }

   memcpy(info_ptr->scal_s_height, sheight, lengthh);

   info_ptr->valid |= PNG_INFO_sCAL;
   info_ptr->free_me |= PNG_FREE_SCAL;
}